

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Result RVar1;
  Enum EVar2;
  Enum op;
  Location LStack_98;
  Var local_70;
  
  LStack_98.field_1.field_0.line = 0;
  LStack_98.field_1._4_8_ = 0;
  LStack_98.filename.data_ = (char *)0x0;
  LStack_98.filename.size_._0_4_ = 0;
  LStack_98.filename.size_._4_4_ = 0;
  Var::Var(&local_70,func_index,&LStack_98);
  RVar1 = SharedValidator::OnCall
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70);
  Var::~Var(&local_70);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    op = Call;
    if (func_index <
        (uint)((int)((ulong)((long)(this->func_types_).
                                   super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->func_types_).
                                  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 6) +
              (int)((ulong)((long)(this->module_->funcs).
                                  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->module_->funcs).
                                 super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) * 0x55555555)) {
      op = InterpCallImport;
    }
    Istream::Emit(this->istream_,op,func_index);
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnCallExpr(Index func_index) {
  CHECK_RESULT(validator_.OnCall(loc, Var(func_index)));

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::Call, func_index);
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
  }

  return Result::Ok;
}